

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_os_dup(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  int *piVar3;
  int64_t iVar4;
  JSValue JVar5;
  int fd;
  int local_4;
  
  local_4 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = JS_ToInt32(ctx,&local_4,*argv);
  if (iVar1 == 0) {
    uVar2 = dup(local_4);
    if (uVar2 == 0xffffffff) {
      piVar3 = __errno_location();
      uVar2 = -*piVar3;
    }
    iVar4 = 0;
  }
  else {
    iVar4 = 6;
    uVar2 = 0;
  }
  JVar5.u._4_4_ = 0;
  JVar5.u.int32 = uVar2;
  JVar5.tag = iVar4;
  return JVar5;
}

Assistant:

static JSValue js_os_dup(JSContext *ctx, JSValueConst this_val,
                         int argc, JSValueConst *argv)
{
    int fd, ret;
    
    if (JS_ToInt32(ctx, &fd, argv[0]))
        return JS_EXCEPTION;
    ret = js_get_errno(dup(fd));
    return JS_NewInt32(ctx, ret);
}